

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rg_demo.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *pCVar3;
  ostream *poVar4;
  int i;
  pointer pRVar5;
  Scalar local_138;
  Vector3i obs;
  RGRegion region;
  RGProblem subproblem;
  RGProblem problem;
  undefined8 local_98;
  int local_90;
  undefined8 local_88;
  int local_80;
  undefined8 local_78;
  int local_70;
  undefined8 local_68;
  int local_60;
  undefined8 local_58;
  int local_50;
  undefined8 local_48;
  int local_40;
  undefined1 *local_3c;
  undefined4 local_34;
  
  problem.obstacle_pts.
  super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  problem.obstacle_pts.
  super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  problem.obstacle_pts.
  super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c = &DAT_300000003;
  local_34 = 3;
  rg::RGProblem::setSeedPoint();
  iVar1 = 1;
  while (subproblem.obstacle_pts.
         super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start =
              (pointer)CONCAT44(subproblem.obstacle_pts.
                                super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar1), iVar1 < 4) {
    for (local_138 = 1; local_138 < 4; local_138 = local_138 + 1) {
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
      region.inner_pts.
      super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
      obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0;
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&obs;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&region,
                          (Scalar *)&subproblem);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(pCVar3,&local_138);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&region);
      local_48 = CONCAT44(obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1],
                          obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0]);
      local_40 = obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
      rg::RGProblem::addObstacle(&problem,&local_48);
    }
    iVar1 = (int)subproblem.obstacle_pts.
                 super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  iVar1 = 1;
  while (subproblem.obstacle_pts.
         super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start =
              (pointer)CONCAT44(subproblem.obstacle_pts.
                                super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar1), iVar1 < 4) {
    for (local_138 = 1; local_138 < 4; local_138 = local_138 + 1) {
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
      region.inner_pts.
      super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
      obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 5;
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&obs;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&region,
                          (Scalar *)&subproblem);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(pCVar3,&local_138);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&region);
      local_58 = CONCAT44(obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1],
                          obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0]);
      local_50 = obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
      rg::RGProblem::addObstacle(&problem,&local_58);
    }
    iVar1 = (int)subproblem.obstacle_pts.
                 super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  for (iVar1 = 1; iVar1 != 4; iVar1 = iVar1 + 1) {
    iVar2 = 1;
    while (subproblem.obstacle_pts.
           super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start =
                (pointer)CONCAT44(subproblem.obstacle_pts.
                                  super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar2), iVar2 < 4)
    {
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
      region.inner_pts.
      super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
      local_138 = 0;
      obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
           iVar1;
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&obs;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&region,&local_138
                         );
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                (pCVar3,(Scalar *)&subproblem);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&region);
      local_68 = CONCAT44(obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1],
                          obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0]);
      local_60 = obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
      rg::RGProblem::addObstacle(&problem,&local_68);
      iVar2 = (int)subproblem.obstacle_pts.
                   super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  for (iVar1 = 1; iVar1 != 4; iVar1 = iVar1 + 1) {
    iVar2 = 1;
    while (subproblem.obstacle_pts.
           super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start =
                (pointer)CONCAT44(subproblem.obstacle_pts.
                                  super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar2), iVar2 < 4)
    {
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
      region.inner_pts.
      super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
      local_138 = 5;
      obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
           iVar1;
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&obs;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&region,&local_138
                         );
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                (pCVar3,(Scalar *)&subproblem);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&region);
      local_78 = CONCAT44(obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1],
                          obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0]);
      local_70 = obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
      rg::RGProblem::addObstacle(&problem,&local_78);
      iVar2 = (int)subproblem.obstacle_pts.
                   super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  for (iVar1 = 1; iVar1 != 4; iVar1 = iVar1 + 1) {
    iVar2 = 1;
    while (subproblem.obstacle_pts.
           super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start =
                (pointer)CONCAT44(subproblem.obstacle_pts.
                                  super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar2), iVar2 < 4)
    {
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
      region.inner_pts.
      super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
      obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
           iVar1;
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&obs;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&region,
                          (Scalar *)&subproblem);
      local_138 = 5;
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(pCVar3,&local_138);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&region);
      local_88 = CONCAT44(obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1],
                          obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0]);
      local_80 = obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
      rg::RGProblem::addObstacle(&problem,&local_88);
      iVar2 = (int)subproblem.obstacle_pts.
                   super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  for (iVar1 = 1; iVar1 != 4; iVar1 = iVar1 + 1) {
    iVar2 = 1;
    while (subproblem.obstacle_pts.
           super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start =
                (pointer)CONCAT44(subproblem.obstacle_pts.
                                  super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar2), iVar2 < 4)
    {
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
      region.inner_pts.
      super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
      obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
           iVar1;
      region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&obs;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&region,
                          (Scalar *)&subproblem);
      local_138 = 5;
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(pCVar3,&local_138);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&region);
      local_98 = CONCAT44(obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1],
                          obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0]);
      local_90 = obs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
      rg::RGProblem::addObstacle(&problem,&local_98);
      iVar2 = (int)subproblem.obstacle_pts.
                   super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  subproblem.obstacle_pts.
  super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  subproblem.obstacle_pts.
  super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subproblem.obstacle_pts.
  super__Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_300000003;
  region.region_bound_pts.super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(region.region_bound_pts.
                         super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
                         super__Vector_impl_data._M_finish._4_4_,3);
  rg::RGProblem::getSubproblem((Matrix *)&problem,(int)&region,(RGProblem *)0xa);
  local_138 = 100;
  rg::inflate_region((RGProblem *)&region,(RGOptions *)&problem);
  for (pRVar5 = region.region_bound_pts.
                super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
                super__Vector_impl_data._M_start;
      pRVar5 != region.region_bound_pts.
                super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>._M_impl.
                super__Vector_impl_data._M_finish; pRVar5 = pRVar5 + 0x10) {
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)pRVar5);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(pRVar5 + 4));
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(pRVar5 + 8));
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  rg::RGRegion::~RGRegion(&region);
  std::
  _Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base((_Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                   *)&subproblem);
  std::
  _Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base((_Vector_base<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                   *)&problem);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  //test_is_required_point();
  
  
  rg::RGProblem problem;

  problem.setSeedPoint(Eigen::Vector3i(3, 3, 3));

  Eigen::Vector3i obs;

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << 0, i, j;
      problem.addObstacle(obs);
    }
  }

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << 5, i, j;
      problem.addObstacle(obs);
    }
  }

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << i, 0, j;
      problem.addObstacle(obs);
    }
  }

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << i, 5, j;
      problem.addObstacle(obs);
    }
  }

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << i, j, 5;
      problem.addObstacle(obs);
    }
  }

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << i, j, 5;
      problem.addObstacle(obs);
    }
  }

  rg::RGProblem subproblem;
  problem.getSubproblem(Eigen::Vector3i(3, 3, 3), 10, &subproblem);
  //Eigen::Vector3i point = subproblem.getSeed();
  //std::cout << "sssss: " << point.x() << " " << point.y() << " " << point.z() << std::endl;
  //std::vector<Eigen::Vector3i> obstacles = problem.getObstacles();

  //for (auto it = obstacles.begin(); it != obstacles.end(); ++it)
  //{
  //  std::cout << it->x() << "," << it->y() << "," << it->z() << std::endl;
  //}

  rg::RGOptions options;

  options.iter_limit = 100;

  rg::RGRegion region = inflate_region(problem, options);

  for (auto it = region.region_bound_pts.begin(); it != region.region_bound_pts.end(); ++it)
  {
    std::cout << it->point.x() << "," << it->point.y() << "," << it->point.z() << std::endl;
  }



  return 0;
}